

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

Abc_Obj_t * Abc_ConvertAigToAig(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pObjOld)

{
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar1;
  Hop_Man_t *p;
  void *pvVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Hop_Obj_t *pHVar5;
  long lVar6;
  Hop_Obj_t *pObj;
  
  aVar1 = pObjOld->field_5;
  p = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
  pObj = (Hop_Obj_t *)((ulong)aVar1.pData & 0xfffffffffffffffe);
  iVar3 = Hop_ObjIsConst1(pObj);
  if (iVar3 == 0) {
    for (lVar6 = 0; lVar6 < (pObjOld->vFanins).nSize; lVar6 = lVar6 + 1) {
      pvVar2 = *(void **)((long)pObjOld->pNtk->vObjs->pArray[(pObjOld->vFanins).pArray[lVar6]] +
                         0x40);
      if (pvVar2 == (void *)0x0) {
        __assert_fail("pFanin->pCopy != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFunc.c"
                      ,0x442,"Abc_Obj_t *Abc_ConvertAigToAig(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      pHVar5 = Hop_ManPi(p,(int)lVar6);
      (pHVar5->field_0).pData = pvVar2;
    }
    Abc_ConvertAigToAig_rec(pNtkAig,pObj);
    Hop_ConeUnmark_rec(pObj);
    pAVar4 = (Abc_Obj_t *)(pObj->field_0).pData;
  }
  else {
    pAVar4 = Abc_AigConst1(pNtkAig);
  }
  return (Abc_Obj_t *)((ulong)(aVar1.iData & 1) ^ (ulong)pAVar4);
}

Assistant:

Abc_Obj_t * Abc_ConvertAigToAig( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pObjOld )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    // get the local AIG
    pHopMan = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pObjOld->pData;
    // check the case of a constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtkAig), Hop_IsComplement(pRoot) );
    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
    {
        assert( pFanin->pCopy != NULL );
        Hop_ManPi(pHopMan, i)->pData = pFanin->pCopy;
    }
    // construct the AIG
    Abc_ConvertAigToAig_rec( pNtkAig, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the result
    return Abc_ObjNotCond( (Abc_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
}